

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_location_handler.c
# Opt level: O0

cio_http_cb_return handle_headers_complete(cio_http_client *client)

{
  cio_http_location_handler *pcVar1;
  _Bool _Var2;
  cio_error cVar3;
  bool bVar4;
  cio_error err;
  cio_websocket_location_handler *wslh;
  cio_http_client *client_local;
  
  _Var2 = check_http_version(client);
  if (((_Var2 ^ 0xffU) & 1) == 0) {
    if (client->http_method == CIO_HTTP_GET) {
      if (*(int *)&(client->parser).field_0x14 < 0) {
        pcVar1 = client->current_handler;
        bVar4 = false;
        if ((*(byte *)&pcVar1[1].on_message_complete >> 2 & 1) == 1) {
          bVar4 = *(int *)((long)&pcVar1[1].on_message_complete + 4) == -1;
        }
        if (bVar4) {
          client_local._4_4_ = CIO_HTTP_CB_ERROR;
        }
        else if ((*(byte *)&pcVar1[1].on_message_complete >> 3 & 1) == 0) {
          client_local._4_4_ = CIO_HTTP_CB_ERROR;
        }
        else if (*(char *)&pcVar1[1].on_schema == '\0') {
          client_local._4_4_ = CIO_HTTP_CB_ERROR;
        }
        else {
          cVar3 = send_upgrade_response(client);
          if (cVar3 == CIO_SUCCESS) {
            client_local._4_4_ = CIO_HTTP_CB_SKIP_BODY;
          }
          else {
            client_local._4_4_ = CIO_HTTP_CB_ERROR;
          }
        }
      }
      else {
        client_local._4_4_ = CIO_HTTP_CB_ERROR;
      }
    }
    else {
      client_local._4_4_ = CIO_HTTP_CB_ERROR;
    }
  }
  else {
    client_local._4_4_ = CIO_HTTP_CB_ERROR;
  }
  return client_local._4_4_;
}

Assistant:

static enum cio_http_cb_return handle_headers_complete(struct cio_http_client *client)
{
	if (cio_unlikely(!check_http_version(client))) {
		return CIO_HTTP_CB_ERROR;
	}

	if (cio_unlikely(client->http_method != CIO_HTTP_GET)) {
		return CIO_HTTP_CB_ERROR;
	}

	if (cio_unlikely(!client->parser.upgrade)) {
		return CIO_HTTP_CB_ERROR;
	}

	const struct cio_websocket_location_handler *wslh = cio_const_container_of(client->current_handler, struct cio_websocket_location_handler, http_location);
	if (cio_unlikely((wslh->flags.subprotocol_requested == 1) && (wslh->chosen_subprotocol == -1))) {
		return CIO_HTTP_CB_ERROR;
	}

	if (cio_unlikely(wslh->flags.ws_version_ok == 0)) {
		return CIO_HTTP_CB_ERROR;
	}

	if (cio_unlikely(wslh->sec_websocket_key[0] == 0)) {
		return CIO_HTTP_CB_ERROR;
	}

	enum cio_error err = send_upgrade_response(client);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return CIO_HTTP_CB_ERROR;
	}

	return CIO_HTTP_CB_SKIP_BODY;
}